

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  bool bVar1;
  int iVar2;
  char (*buffer) [7];
  undefined4 in_ESI;
  int result;
  char *system_message;
  memory_buffer buf;
  buffer<char> *in_stack_fffffffffffffd48;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 uVar3;
  undefined1 *puVar4;
  char **in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  char (*format_str) [7];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffdb0;
  string_view in_stack_fffffffffffffdb8;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  undefined4 local_1c;
  
  puVar4 = &stack0xfffffffffffffdc7;
  local_1c = in_ESI;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd50,(allocator<char> *)in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
            (in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
  do {
    buffer = (char (*) [7])detail::buffer<char>::operator[]<int>(&local_238.super_buffer<char>,0);
    uVar3 = local_1c;
    format_str = buffer;
    detail::buffer<char>::size(&local_238.super_buffer<char>);
    iVar2 = detail::safe_strerror
                      ((int)((ulong)puVar4 >> 0x20),(char **)buffer,
                       CONCAT44(uVar3,in_stack_fffffffffffffd60));
    if (iVar2 == 0) {
      detail::buffer_appender<char>::buffer_appender
                ((buffer_appender<char> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      format_to<fmt::v7::detail::buffer_appender<char>,char[7],fmt::v7::basic_string_view<char>&,char*&,true>
                ((buffer_appender<char>)in_stack_fffffffffffffdb0.container,format_str,
                 (basic_string_view<char> *)CONCAT44(iVar2,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd98);
      bVar1 = true;
LAB_00256803:
      iVar2 = (int)((ulong)format_str >> 0x20);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                (in_stack_fffffffffffffd50);
      if (!bVar1) {
        detail::format_error_code
                  (in_stack_fffffffffffffdb0.container,iVar2,in_stack_fffffffffffffdb8);
      }
      return;
    }
    if (iVar2 != 0x22) {
      bVar1 = false;
      goto LAB_00256803;
    }
    in_stack_fffffffffffffd50 = &local_238;
    detail::buffer<char>::size(&in_stack_fffffffffffffd50->super_buffer<char>);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
  } while( true );
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }